

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXUtil.cpp
# Opt level: O0

size_t Assimp::FBX::Util::DecodeBase64(char *in,size_t inLength,uint8_t *out,size_t maxOutLength)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  ulong uStack_50;
  uint8_t table_value;
  size_t src_offset;
  int valb;
  int val;
  size_t dst_offset;
  size_t realLength;
  size_t maxOutLength_local;
  uint8_t *out_local;
  size_t inLength_local;
  char *in_local;
  
  if ((maxOutLength == 0) || (inLength < 2)) {
    in_local = (char *)0x0;
  }
  else {
    cVar1 = in[inLength - 1];
    cVar2 = in[inLength - 2];
    _valb = (char *)0x0;
    src_offset._4_4_ = 0;
    src_offset._0_4_ = -8;
    for (uStack_50 = 0; uStack_50 < (inLength - (cVar1 == '=')) - (ulong)(cVar2 == '=');
        uStack_50 = uStack_50 + 1) {
      bVar3 = DecodeBase64(in[uStack_50]);
      if (bVar3 == 0xff) {
        return 0;
      }
      src_offset._4_4_ = src_offset._4_4_ * 0x40 + (uint)bVar3;
      iVar4 = (int)src_offset + 6;
      if (-1 < iVar4) {
        out[(long)_valb] = (uint8_t)((int)src_offset._4_4_ >> ((byte)iVar4 & 0x1f));
        src_offset._4_4_ = src_offset._4_4_ & 0xfff;
        iVar4 = (int)src_offset + -2;
        _valb = _valb + 1;
      }
      src_offset._0_4_ = iVar4;
    }
    in_local = _valb;
  }
  return (size_t)in_local;
}

Assistant:

size_t DecodeBase64(const char* in, size_t inLength, uint8_t* out, size_t maxOutLength)
{
    if (maxOutLength == 0 || inLength < 2) {
        return 0;
    }
    const size_t realLength = inLength - size_t(in[inLength - 1] == '=') - size_t(in[inLength - 2] == '=');
    size_t dst_offset = 0;
    int val = 0, valb = -8;
    for (size_t src_offset = 0; src_offset < realLength; ++src_offset)
    {
        const uint8_t table_value = Util::DecodeBase64(in[src_offset]);
        if (table_value == 255)
        {
            return 0;
        }
        val = (val << 6) + table_value;
        valb += 6;
        if (valb >= 0)
        {
            out[dst_offset++] = static_cast<uint8_t>((val >> valb) & 0xFF);
            valb -= 8;
            val &= 0xFFF;
        }
    }
    return dst_offset;
}